

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

void * __thiscall ctemplate::BaseArena::GetMemory(BaseArena *this,size_t size,int align)

{
  ulong uVar1;
  void *pvVar2;
  
  uVar1 = *(ulong *)(this + 0x10);
  if (*(ulong *)(this + 0x20) < uVar1) {
    __assert_fail("remaining_ <= block_size_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.h"
                  ,0x17a,"void *ctemplate::BaseArena::GetMemory(const size_t, const int)");
  }
  if (size != 0) {
    if (align == 1 && (size <= uVar1 && uVar1 - size != 0)) {
      pvVar2 = *(void **)(this + 0x28);
      *(void **)(this + 0x38) = pvVar2;
      *(size_t *)(this + 0x28) = size + (long)pvVar2;
      *(ulong *)(this + 0x10) = uVar1 - size;
      return pvVar2;
    }
    pvVar2 = (void *)ctemplate::BaseArena::GetMemoryFallback((ulong)this,(int)size);
    return pvVar2;
  }
  pvVar2 = (void *)ctemplate::BaseArena::GetMemoryFallback((ulong)this,0);
  return pvVar2;
}

Assistant:

void* GetMemory(const size_t size, const int align) {
    assert(remaining_ <= block_size_);          // an invariant
    if ( size > 0 && size < remaining_ && align == 1 ) {       // common case
      last_alloc_ = freestart_;
      freestart_ += size;
      remaining_ -= size;
      return reinterpret_cast<void*>(last_alloc_);
    }
    return GetMemoryFallback(size, align);
  }